

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_declaration.c
# Opt level: O1

mpc_val_t * fold_type_specifier_struct(int n,mpc_val_t **xs)

{
  undefined4 *__ptr;
  undefined4 *puVar1;
  
  __ptr = (undefined4 *)xs[1];
  puVar1 = (undefined4 *)malloc(0x20);
  *puVar1 = 1;
  *(mpc_val_t **)(puVar1 + 2) = xs[2];
  puVar1[4] = *__ptr;
  *(mpc_val_t **)(puVar1 + 6) = xs[3];
  free(*xs);
  free(__ptr);
  return puVar1;
}

Assistant:

static mpc_val_t *fold_type_specifier_struct(int n, mpc_val_t **xs)
{
    mpc_state_t *state = xs[1];

    c_type_specifier_struct_t *type_specifier = malloc(sizeof(c_type_specifier_struct_t));
    type_specifier->base.type = C_TYPE_SPECIFIER_STRUCT;
    type_specifier->name = xs[2];
    type_specifier->name_position = state->pos;
    type_specifier->declarations = xs[3];

    free(xs[0]);
    free(state);

    return type_specifier;
}